

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlRecoverMemory(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined4 local_44;
  undefined1 local_40 [4];
  int size;
  Py_ssize_t py_buffsize0;
  char *buffer;
  xmlDocPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlRecoverMemory");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"s#i:xmlRecoverMemory",&py_buffsize0,local_40,&local_44);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      buffer = (char *)xmlRecoverMemory(py_buffsize0,local_44);
      self_local = libxml_xmlDocPtrWrap((xmlDocPtr)buffer);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlRecoverMemory(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlDocPtr c_retval;
    char * buffer;
    Py_ssize_t  py_buffsize0;
    int size;

    if (libxml_deprecationWarning("xmlRecoverMemory") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"s#i:xmlRecoverMemory", &buffer, &py_buffsize0, &size))
        return(NULL);

    c_retval = xmlRecoverMemory(buffer, size);
    py_retval = libxml_xmlDocPtrWrap((xmlDocPtr) c_retval);
    return(py_retval);
}